

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

jx9_value * VmExtractMemObj(jx9_vm *pVm,SyString *pName,int bDup,int bCreate)

{
  SyHash *pHash;
  VmFrame *pVVar1;
  void *pvVar2;
  sxi32 sVar3;
  SyHashEntry *pSVar4;
  char *pKey;
  sxu32 nKeyLen;
  undefined4 uVar5;
  undefined8 unaff_R13;
  jx9_value *pjVar6;
  uint local_4c;
  VmFrame *local_48;
  VmSlot sLocal;
  
  if ((pName == (SyString *)0x0) || (nKeyLen = pName->nByte, nKeyLen == 0)) {
    pName = &VmExtractMemObj::sAnnon;
    uVar5 = (undefined4)CONCAT71((int7)((ulong)unaff_R13 >> 8),1);
    bDup = 0;
    nKeyLen = 1;
  }
  else {
    uVar5 = 0;
  }
  pVVar1 = pVm->pFrame;
  pSVar4 = SyHashGet(&pVm->hSuper,pName->zString,nKeyLen);
  if (pSVar4 == (SyHashEntry *)0x0) {
    local_48 = (VmFrame *)CONCAT44(local_48._4_4_,uVar5);
    pHash = &pVVar1->hVar;
    pSVar4 = SyHashGet(pHash,pName->zString,pName->nByte);
    if (pSVar4 == (SyHashEntry *)0x0) {
      if (bCreate != 0) {
        pKey = pName->zString;
        local_48 = pVVar1;
        pjVar6 = jx9VmReserveMemObj(pVm,&local_4c);
        if ((pjVar6 != (jx9_value *)0x0) &&
           ((bDup == 0 ||
            (pKey = SyMemBackendStrDup(&pVm->sAllocator,pName->zString,pName->nByte),
            pKey != (char *)0x0)))) {
          sVar3 = SyHashInsert(pHash,pKey,pName->nByte,(void *)(ulong)local_4c);
          if (sVar3 == 0) {
            if (local_48->pParent == (VmFrame *)0x0) {
              return pjVar6;
            }
            sLocal.nIdx = local_4c;
            SySetPut(&local_48->sLocal,&sLocal);
            return pjVar6;
          }
          sLocal.nIdx = local_4c;
          sLocal.pUserData = (void *)0x0;
          SySetPut(&pVm->aFreeObj,&sLocal);
        }
      }
    }
    else if (*(uint *)&pSVar4->pUserData < (pVm->aMemObj).nUsed) {
      pvVar2 = (pVm->aMemObj).pBase;
      pjVar6 = (jx9_value *)
               ((ulong)(*(uint *)&pSVar4->pUserData * (pVm->aMemObj).eSize) + (long)pvVar2);
      if (((byte)local_48 & pvVar2 != (void *)0x0) != 1) {
        return pjVar6;
      }
      jx9MemObjRelease(pjVar6);
      return pjVar6;
    }
  }
  else if (*(uint *)&pSVar4->pUserData < (pVm->aMemObj).nUsed) {
    return (jx9_value *)
           ((ulong)(*(uint *)&pSVar4->pUserData * (pVm->aMemObj).eSize) + (long)(pVm->aMemObj).pBase
           );
  }
  return (jx9_value *)0x0;
}

Assistant:

static jx9_value * VmExtractMemObj(
	jx9_vm *pVm,           /* Target VM */
	const SyString *pName, /* Variable name */
	int bDup,              /* True to duplicate variable name */
	int bCreate            /* True to create the variable if non-existent */
	)
{
	int bNullify = FALSE;
	SyHashEntry *pEntry;
	VmFrame *pFrame;
	jx9_value *pObj;
	sxu32 nIdx;
	sxi32 rc;
	/* Point to the top active frame */
	pFrame = pVm->pFrame;
	/* Perform the lookup */
	if( pName == 0 || pName->nByte < 1 ){
		static const SyString sAnnon = { " " , sizeof(char) };
		pName = &sAnnon;
		/* Always nullify the object */
		bNullify = TRUE;
		bDup = FALSE;
	}
	/* Check the superglobals table first */
	pEntry = SyHashGet(&pVm->hSuper, (const void *)pName->zString, pName->nByte);
	if( pEntry == 0 ){
		/* Query the top active frame */
		pEntry = SyHashGet(&pFrame->hVar, (const void *)pName->zString, pName->nByte);
		if( pEntry == 0 ){
			char *zName = (char *)pName->zString;
			VmSlot sLocal;
			if( !bCreate ){
				/* Do not create the variable, return NULL */
				return 0;
			}
			/* No such variable, automatically create a new one and install
			 * it in the current frame.
			 */
			pObj = jx9VmReserveMemObj(&(*pVm),&nIdx);
			if( pObj == 0 ){
				return 0;
			}
			if( bDup ){
				/* Duplicate name */
				zName = SyMemBackendStrDup(&pVm->sAllocator, pName->zString, pName->nByte);
				if( zName == 0 ){
					return 0;
				}
			}
			/* Link to the top active VM frame */
			rc = SyHashInsert(&pFrame->hVar, zName, pName->nByte, SX_INT_TO_PTR(nIdx));
			if( rc != SXRET_OK ){
				/* Return the slot to the free pool */
				sLocal.nIdx = nIdx;
				sLocal.pUserData = 0;
				SySetPut(&pVm->aFreeObj, (const void *)&sLocal);
				return 0;
			}
			if( pFrame->pParent != 0 ){
				/* Local variable */
				sLocal.nIdx = nIdx;
				SySetPut(&pFrame->sLocal, (const void *)&sLocal);
			}
		}else{
			/* Extract variable contents */
			nIdx = (sxu32)SX_PTR_TO_INT(pEntry->pUserData);
			pObj = (jx9_value *)SySetAt(&pVm->aMemObj, nIdx);
			if( bNullify && pObj ){
				jx9MemObjRelease(pObj);
			}
		}
	}else{
		/* Superglobal */
		nIdx = (sxu32)SX_PTR_TO_INT(pEntry->pUserData);
		pObj = (jx9_value *)SySetAt(&pVm->aMemObj, nIdx);
	}
	return pObj;
}